

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

uint32_t google::protobuf::internal::anon_unknown_0::RecodeTagForFastParsing(uint32_t tag)

{
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  uint32_t hibits;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  uint local_20;
  uint local_1c;
  string *local_18;
  string *absl_log_internal_check_op_result;
  uint32_t tag_local;
  
  absl_log_internal_check_op_result._4_4_ = tag;
  local_1c = absl::lts_20240722::log_internal::GetReferenceableValue(tag);
  local_20 = absl::lts_20240722::log_internal::GetReferenceableValue(0x3fff);
  local_18 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_int,unsigned_int>
                       (&local_1c,&local_20,"tag <= 0x3FFFu");
  if (local_18 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x17a,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  if ((absl_log_internal_check_op_result._4_4_ & 0xffffff80) != 0) {
    absl_log_internal_check_op_result._4_4_ =
         absl_log_internal_check_op_result._4_4_ +
         (absl_log_internal_check_op_result._4_4_ & 0xffffff80) + 0x80;
  }
  return absl_log_internal_check_op_result._4_4_;
}

Assistant:

uint32_t RecodeTagForFastParsing(uint32_t tag) {
  ABSL_DCHECK_LE(tag, 0x3FFFu);
  // Construct the varint-coded tag. If it is more than 7 bits, we need to
  // shift the high bits and add a continue bit.
  if (uint32_t hibits = tag & 0xFFFFFF80) {
    // hi = tag & ~0x7F
    // lo = tag & 0x7F
    // This shifts hi to the left by 1 to the next byte and sets the
    // continuation bit.
    tag = tag + hibits + 128;
  }
  return tag;
}